

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

string * duckdb::VectorTypeToString(VectorType type)

{
  undefined1 in_SIL;
  string *in_RDI;
  allocator local_21;
  allocator local_20;
  allocator local_1f;
  allocator local_1e;
  allocator local_1d [19];
  allocator local_a [10];
  
  switch(in_SIL) {
  case 0:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"FLAT",local_a);
    ::std::allocator<char>::~allocator((allocator<char> *)local_a);
    break;
  case 1:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"FSST",local_1d);
    ::std::allocator<char>::~allocator((allocator<char> *)local_1d);
    break;
  case 2:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"CONSTANT",&local_20);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_20);
    break;
  case 3:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"DICTIONARY",&local_1f);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1f);
    break;
  case 4:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"SEQUENCE",&local_1e);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1e);
    break;
  default:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)in_RDI,"UNKNOWN",&local_21);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return in_RDI;
}

Assistant:

string VectorTypeToString(VectorType type) {
	switch (type) {
	case VectorType::FLAT_VECTOR:
		return "FLAT";
	case VectorType::FSST_VECTOR:
		return "FSST";
	case VectorType::SEQUENCE_VECTOR:
		return "SEQUENCE";
	case VectorType::DICTIONARY_VECTOR:
		return "DICTIONARY";
	case VectorType::CONSTANT_VECTOR:
		return "CONSTANT";
	default:
		return "UNKNOWN";
	}
}